

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getRSS.h
# Opt level: O1

string * __thiscall
bwtil::getFormattedSpaceUsage_abi_cxx11_(string *__return_storage_ptr__,bwtil *this,ulint bytes)

{
  ostream *poVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  stringstream ss;
  stringstream asStack_198 [128];
  ios_base local_118 [264];
  undefined1 extraout_var [56];
  
  auVar4._0_8_ = std::__cxx11::stringstream::stringstream(asStack_198);
  auVar4._8_56_ = extraout_var;
  auVar3 = auVar4._0_16_;
  if (this < (bwtil *)0x40000000) {
    if (this < (bwtil *)0x100000) {
      if (this < (bwtil *)0x400) goto LAB_0010242d;
      auVar3 = vcvtusi2sd_avx512f(auVar3,this);
      poVar1 = std::ostream::_M_insert<double>(auVar3._0_8_ * 0.0009765625);
      pcVar2 = " KB";
    }
    else {
      auVar3 = vcvtusi2sd_avx512f(auVar3,this);
      poVar1 = std::ostream::_M_insert<double>(auVar3._0_8_ * 9.5367431640625e-07);
      pcVar2 = " MB";
    }
  }
  else {
    auVar3 = vcvtusi2sd_avx512f(auVar3,this);
    poVar1 = std::ostream::_M_insert<double>(auVar3._0_8_ * 9.313225746154785e-10);
    pcVar2 = " GB";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,3);
LAB_0010242d:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

string getFormattedSpaceUsage(ulint bytes){

	stringstream ss;

	if(bytes/((ulint)1<<30) > 0)
		ss << (double)bytes/((ulint)1<<30) << " GB";
	else if (bytes/((ulint)1<<20) > 0)
		ss << (double)bytes/((ulint)1<<20) << " MB";
	else if (bytes/((ulint)1<<10) > 0)
		ss << (double)bytes/((ulint)1<<10) << " KB";

	return ss.str();

}